

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout_p.h
# Opt level: O1

void __thiscall QDockWidgetGroupWindow::~QDockWidgetGroupWindow(QDockWidgetGroupWindow *this)

{
  int *piVar1;
  
  *(undefined ***)this = &PTR_metaObject_00803378;
  *(undefined ***)(this + 0x10) = &PTR__QDockWidgetGroupWindow_00803528;
  piVar1 = *(int **)(this + 0x38);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x38),4,0x10);
    }
  }
  QWidget::~QWidget((QWidget *)this);
  operator_delete(this,0x58);
  return;
}

Assistant:

class Q_AUTOTEST_EXPORT QDockWidgetGroupWindow : public QWidget
{
    Q_OBJECT
public:
    explicit QDockWidgetGroupWindow(QWidget *parent = nullptr, Qt::WindowFlags f = {})
        : QWidget(parent, f)
    {
    }
    QDockAreaLayoutInfo *layoutInfo() const;
#if QT_CONFIG(tabbar)
    const QDockAreaLayoutInfo *tabLayoutInfo() const;
    QDockWidget *activeTabbedDockWidget() const;
#endif
    void destroyOrHideIfEmpty();
    bool hasVisibleDockWidgets() const;
    void adjustFlags();
    bool hasNativeDecos() const;

    bool hover(QLayoutItem *widgetItem, const QPoint &mousePos);
    void updateCurrentGapRect();
    void restore();
    void apply();
    void childEvent(QChildEvent *event) override;
    void reparentToMainWindow(QDockWidget *dockWidget);
    void destroyIfSingleItemLeft();
    QList<QDockWidget *> dockWidgets() const { return findChildren<QDockWidget *>(); }

    QRect currentGapRect;
    QList<int> currentGapPos;

signals:
    void resized();

protected:
    bool event(QEvent *) override;
    bool eventFilter(QObject *obj, QEvent *event) override;
    void paintEvent(QPaintEvent*) override;

private:
    QSize m_removedFrameSize;
}